

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfortestoutput.h
# Opt level: O2

ostream * UnitTests::details::streamit<char*,char[6]>(ostream *s,undefined8 *t)

{
  ostream *poVar1;
  expected_got_outputter<char_*> local_18;
  
  local_18.t = (char **)*t;
  poVar1 = operator<<(s,&local_18);
  poVar1 = std::operator<<(poVar1," (uncoerced=");
  std::operator<<(poVar1,(char *)t[1]);
  poVar1 = std::operator<<(poVar1,")");
  return poVar1;
}

Assistant:

std::ostream& streamit(
            std::ostream& s, const expected_got_outputter_with_coercion<T, U>& t, std::false_type /*unused*/)
        {
            return s << stream(t.t) << " (uncoerced=" << stream(t.u) << ")";
        }